

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall
Omega_h::get_mident_metrics
          (Omega_h *this,Mesh *mesh,Int ent_dim,LOs *entities,Reals *v2m,bool has_degen)

{
  int *piVar1;
  Alloc *pAVar2;
  LO nmetrics;
  uint uVar3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  Alloc *pAVar5;
  ulong uVar6;
  LOs *this_00;
  Reals RVar7;
  LOs local_140;
  LOs local_130;
  LOs local_120;
  LOs local_110;
  LOs local_100;
  LOs local_f0;
  LOs local_e0;
  Reals local_d0;
  Reals local_c0;
  Reals local_b0;
  Reals local_a0;
  Reals local_90;
  Reals local_80;
  Reals local_70;
  Reals local_60;
  undefined1 local_50 [32];
  void *pvVar4;
  
  pAVar5 = (entities->write_).shared_alloc_.alloc;
  if (((ulong)pAVar5 & 1) == 0) {
    uVar6 = pAVar5->size;
  }
  else {
    uVar6 = (ulong)pAVar5 >> 3;
  }
  if ((int)(uVar6 >> 2) == 0) {
    local_50._0_8_ = (Alloc *)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50);
    Read<double>::Read((Read<double> *)this,(initializer_list<double>)ZEXT816(0),(string *)local_50)
    ;
    pvVar4 = extraout_RDX;
    if ((Alloc *)local_50._0_8_ == (Alloc *)(local_50 + 0x10)) goto LAB_003373b3;
    uVar6 = local_50._16_8_ + 1;
    pAVar5 = (Alloc *)local_50._0_8_;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    local_60.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.write_.shared_alloc_.alloc =
             (Alloc *)((local_60.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_60.write_.shared_alloc_.alloc)->use_count =
             (local_60.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
    uVar3 = get_metrics_dim(nmetrics,&local_60);
    pAVar5 = local_60.write_.shared_alloc_.alloc;
    if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
        local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_60.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
      }
    }
    if ((ent_dim ^ 3U) == 0 && (uVar3 ^ 3) == 0) {
      local_e0.write_.shared_alloc_.alloc = (entities->write_).shared_alloc_.alloc;
      if (((ulong)local_e0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_e0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_e0.write_.shared_alloc_.alloc =
               (Alloc *)((local_e0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_e0.write_.shared_alloc_.alloc)->use_count =
               (local_e0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_e0.write_.shared_alloc_.direct_ptr = (entities->write_).shared_alloc_.direct_ptr;
      local_70.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_70.write_.shared_alloc_.alloc =
               (Alloc *)((local_70.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_70.write_.shared_alloc_.alloc)->use_count =
               (local_70.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_70.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar7 = get_mident_metrics_tmpl<3,3>(this,mesh,&local_e0,&local_70,has_degen);
      pAVar2 = local_70.write_.shared_alloc_.alloc;
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      pAVar5 = local_e0.write_.shared_alloc_.alloc;
      if (((ulong)local_70.write_.shared_alloc_.alloc & 7) == 0 &&
          local_70.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_70.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_70.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar4 = extraout_RDX_00;
          pAVar5 = local_e0.write_.shared_alloc_.alloc;
        }
      }
    }
    else if ((uVar3 ^ 3) == 0 && (ent_dim ^ 1U) == 0) {
      local_f0.write_.shared_alloc_.alloc = (entities->write_).shared_alloc_.alloc;
      if (((ulong)local_f0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_f0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_f0.write_.shared_alloc_.alloc =
               (Alloc *)((local_f0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_f0.write_.shared_alloc_.alloc)->use_count =
               (local_f0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_f0.write_.shared_alloc_.direct_ptr = (entities->write_).shared_alloc_.direct_ptr;
      local_80.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_80.write_.shared_alloc_.alloc =
               (Alloc *)((local_80.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_80.write_.shared_alloc_.alloc)->use_count =
               (local_80.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_80.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar7 = get_mident_metrics_tmpl<3,1>(this,mesh,&local_f0,&local_80,has_degen);
      pAVar2 = local_80.write_.shared_alloc_.alloc;
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      pAVar5 = local_f0.write_.shared_alloc_.alloc;
      if (((ulong)local_80.write_.shared_alloc_.alloc & 7) == 0 &&
          local_80.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_80.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_80.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar4 = extraout_RDX_01;
          pAVar5 = local_f0.write_.shared_alloc_.alloc;
        }
      }
    }
    else if ((ent_dim ^ 2U) == 0 && (uVar3 ^ 2) == 0) {
      local_100.write_.shared_alloc_.alloc = (entities->write_).shared_alloc_.alloc;
      if (((ulong)local_100.write_.shared_alloc_.alloc & 7) == 0 &&
          local_100.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_100.write_.shared_alloc_.alloc =
               (Alloc *)((local_100.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_100.write_.shared_alloc_.alloc)->use_count =
               (local_100.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_100.write_.shared_alloc_.direct_ptr = (entities->write_).shared_alloc_.direct_ptr;
      local_90.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_90.write_.shared_alloc_.alloc =
               (Alloc *)((local_90.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_90.write_.shared_alloc_.alloc)->use_count =
               (local_90.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_90.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar7 = get_mident_metrics_tmpl<2,2>(this,mesh,&local_100,&local_90,has_degen);
      pAVar2 = local_90.write_.shared_alloc_.alloc;
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      pAVar5 = local_100.write_.shared_alloc_.alloc;
      if (((ulong)local_90.write_.shared_alloc_.alloc & 7) == 0 &&
          local_90.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_90.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_90.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar4 = extraout_RDX_02;
          pAVar5 = local_100.write_.shared_alloc_.alloc;
        }
      }
    }
    else {
      if ((ent_dim ^ 1U) != 0 || (uVar3 ^ 2) != 0) {
        if ((ent_dim ^ 3U) == 0 && (uVar3 ^ 1) == 0) {
          local_120.write_.shared_alloc_.alloc = (entities->write_).shared_alloc_.alloc;
          if (((ulong)local_120.write_.shared_alloc_.alloc & 7) == 0 &&
              local_120.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_120.write_.shared_alloc_.alloc =
                   (Alloc *)((local_120.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_120.write_.shared_alloc_.alloc)->use_count =
                   (local_120.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_120.write_.shared_alloc_.direct_ptr = (entities->write_).shared_alloc_.direct_ptr;
          local_b0.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
          if (((ulong)local_b0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_b0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_b0.write_.shared_alloc_.alloc =
                   (Alloc *)((local_b0.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_b0.write_.shared_alloc_.alloc)->use_count =
                   (local_b0.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_b0.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
          get_mident_metrics_tmpl<1,3>(this,mesh,&local_120,&local_b0,has_degen);
          Read<double>::~Read(&local_b0);
          this_00 = &local_120;
        }
        else if ((ent_dim ^ 2U) == 0 && (uVar3 ^ 1) == 0) {
          local_130.write_.shared_alloc_.alloc = (entities->write_).shared_alloc_.alloc;
          if (((ulong)local_130.write_.shared_alloc_.alloc & 7) == 0 &&
              local_130.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_130.write_.shared_alloc_.alloc =
                   (Alloc *)((local_130.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_130.write_.shared_alloc_.alloc)->use_count =
                   (local_130.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_130.write_.shared_alloc_.direct_ptr = (entities->write_).shared_alloc_.direct_ptr;
          local_c0.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
          if (((ulong)local_c0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_c0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_c0.write_.shared_alloc_.alloc =
                   (Alloc *)((local_c0.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_c0.write_.shared_alloc_.alloc)->use_count =
                   (local_c0.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_c0.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
          get_mident_metrics_tmpl<1,2>(this,mesh,&local_130,&local_c0,has_degen);
          Read<double>::~Read(&local_c0);
          this_00 = &local_130;
        }
        else {
          if ((ent_dim != 1) || (uVar3 != 1)) {
            fail("assertion %s failed at %s +%d\n","false",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
                 ,0x62);
          }
          local_140.write_.shared_alloc_.alloc = (entities->write_).shared_alloc_.alloc;
          if (((ulong)local_140.write_.shared_alloc_.alloc & 7) == 0 &&
              local_140.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_140.write_.shared_alloc_.alloc =
                   (Alloc *)((local_140.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_140.write_.shared_alloc_.alloc)->use_count =
                   (local_140.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_140.write_.shared_alloc_.direct_ptr = (entities->write_).shared_alloc_.direct_ptr;
          local_d0.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
          if (((ulong)local_d0.write_.shared_alloc_.alloc & 7) == 0 &&
              local_d0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_d0.write_.shared_alloc_.alloc =
                   (Alloc *)((local_d0.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_d0.write_.shared_alloc_.alloc)->use_count =
                   (local_d0.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_d0.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
          get_mident_metrics_tmpl<1,1>(this,mesh,&local_140,&local_d0,has_degen);
          Read<double>::~Read(&local_d0);
          this_00 = &local_140;
        }
        Read<int>::~Read(this_00);
        pvVar4 = extraout_RDX_05;
        goto LAB_003373b3;
      }
      local_110.write_.shared_alloc_.alloc = (entities->write_).shared_alloc_.alloc;
      if (((ulong)local_110.write_.shared_alloc_.alloc & 7) == 0 &&
          local_110.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_110.write_.shared_alloc_.alloc =
               (Alloc *)((local_110.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_110.write_.shared_alloc_.alloc)->use_count =
               (local_110.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_110.write_.shared_alloc_.direct_ptr = (entities->write_).shared_alloc_.direct_ptr;
      local_a0.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
      if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_a0.write_.shared_alloc_.alloc =
               (Alloc *)((local_a0.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_a0.write_.shared_alloc_.alloc)->use_count =
               (local_a0.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_a0.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
      RVar7 = get_mident_metrics_tmpl<2,1>(this,mesh,&local_110,&local_a0,has_degen);
      pAVar2 = local_a0.write_.shared_alloc_.alloc;
      pvVar4 = RVar7.write_.shared_alloc_.direct_ptr;
      pAVar5 = local_110.write_.shared_alloc_.alloc;
      if (((ulong)local_a0.write_.shared_alloc_.alloc & 7) == 0 &&
          local_a0.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_a0.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_a0.write_.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar4 = extraout_RDX_03;
          pAVar5 = local_110.write_.shared_alloc_.alloc;
        }
      }
    }
    if (((ulong)pAVar5 & 7) != 0 || pAVar5 == (Alloc *)0x0) goto LAB_003373b3;
    piVar1 = &pAVar5->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_003373b3;
    Alloc::~Alloc(pAVar5);
    uVar6 = 0x48;
  }
  operator_delete(pAVar5,uVar6);
  pvVar4 = extraout_RDX_04;
LAB_003373b3:
  RVar7.write_.shared_alloc_.direct_ptr = pvVar4;
  RVar7.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar7.write_.shared_alloc_;
}

Assistant:

Reals get_mident_metrics(
    Mesh* mesh, Int ent_dim, LOs entities, Reals v2m, bool has_degen) {
  if (entities.size() == 0) return Reals({});
  auto metrics_dim = get_metrics_dim(mesh->nverts(), v2m);
  if (metrics_dim == 3 && ent_dim == 3) {
    return get_mident_metrics_tmpl<3, 3>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 3 && ent_dim == 1) {
    return get_mident_metrics_tmpl<3, 1>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 2 && ent_dim == 2) {
    return get_mident_metrics_tmpl<2, 2>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 2 && ent_dim == 1) {
    return get_mident_metrics_tmpl<2, 1>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 3) {
    return get_mident_metrics_tmpl<1, 3>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 2) {
    return get_mident_metrics_tmpl<1, 2>(mesh, entities, v2m, has_degen);
  }
  if (metrics_dim == 1 && ent_dim == 1) {
    return get_mident_metrics_tmpl<1, 1>(mesh, entities, v2m, has_degen);
  }
  OMEGA_H_NORETURN(Reals());
}